

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void __thiscall libtorrent::session_proxy::~session_proxy(session_proxy *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  if ((((this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) &&
      (p_Var1 = (this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     && (p_Var1->_M_use_count == 1)) {
    std::thread::join();
  }
  p_Var1 = (this->m_impl).
           super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->m_io_service).
           super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

session_proxy::~session_proxy()
	{
		if (m_thread && m_thread.use_count() == 1)
		{
#if defined TORRENT_ASIO_DEBUGGING
			wait_for_asio_handlers();
#endif
			m_thread->join();
		}
	}